

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int arkGetDky(ARKodeMem ark_mem,realtype t,int k,N_Vector dky)

{
  long in_RDX;
  ARKodeMem in_RDI;
  ARKodeMem in_XMM0_Qa;
  void *arkode_mem;
  ARKInterp interp;
  double tau;
  int retval;
  realtype tn1;
  realtype tp;
  realtype tfuzz;
  realtype s;
  N_Vector in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  uint local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkGetDky","arkode_mem = NULL illegal.");
    local_4 = 0xffffffeb;
  }
  else if (in_RDX == 0) {
    arkProcessError(in_RDI,-0x1a,"ARKode","arkGetDky","dky = NULL illegal.");
    local_4 = 0xffffffe6;
  }
  else if (in_RDI->interp == (ARKInterp)0x0) {
    arkProcessError(in_RDI,-0x15,"ARKode","arkGetDky","Missing interpolation structure");
    local_4 = 0xffffffeb;
  }
  else {
    arkode_mem = (void *)(in_RDI->uround * 100.0 * (ABS(in_RDI->tcur) + ABS(in_RDI->hold)));
    if (in_RDI->hold <= 0.0 && in_RDI->hold != 0.0) {
      arkode_mem = (void *)-(double)arkode_mem;
    }
    interp = (ARKInterp)((in_RDI->tcur - in_RDI->hold) - (double)arkode_mem);
    tau = in_RDI->tcur + (double)arkode_mem;
    if (((double)in_XMM0_Qa - (double)interp) * ((double)in_XMM0_Qa - tau) <= 0.0) {
      local_4 = arkInterpEvaluate(arkode_mem,interp,tau,in_stack_ffffffffffffffb4,
                                  in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      if (local_4 == 0) {
        local_4 = 0;
      }
      else {
        arkProcessError(in_RDI,(int)(ulong)local_4,"ARKode","arkGetDky",
                        "Error calling arkInterpEvaluate");
      }
    }
    else {
      arkProcessError(in_XMM0_Qa,(int)(in_RDI->tcur - in_RDI->hold),(char *)in_RDI->tcur,
                      (char *)in_RDI,(char *)0xffffffe7,"ARKode","arkGetDky",
                      "Illegal value for t.t = %lg is not between tcur - hold = %lg and tcur = %lg."
                     );
      local_4 = 0xffffffe7;
    }
  }
  return local_4;
}

Assistant:

int arkGetDky(ARKodeMem ark_mem, realtype t, int k, N_Vector dky)
{
  realtype s, tfuzz, tp, tn1;
  int retval;

  /* Check all inputs for legality */
  if (ark_mem == NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode", "arkGetDky",
                    MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  if (dky == NULL) {
    arkProcessError(ark_mem, ARK_BAD_DKY, "ARKode", "arkGetDky",
                    MSG_ARK_NULL_DKY);
    return(ARK_BAD_DKY);
  }
  if (ark_mem->interp == NULL) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode", "arkGetDky",
                    "Missing interpolation structure");
    return(ARK_MEM_NULL);
  }


  /* Allow for some slack */
  tfuzz = FUZZ_FACTOR * ark_mem->uround *
    (SUNRabs(ark_mem->tcur) + SUNRabs(ark_mem->hold));
  if (ark_mem->hold < ZERO) tfuzz = -tfuzz;
  tp = ark_mem->tcur - ark_mem->hold - tfuzz;
  tn1 = ark_mem->tcur + tfuzz;
  if ((t-tp)*(t-tn1) > ZERO) {
    arkProcessError(ark_mem, ARK_BAD_T, "ARKode", "arkGetDky",
                    MSG_ARK_BAD_T, t, ark_mem->tcur-ark_mem->hold,
                    ark_mem->tcur);
    return(ARK_BAD_T);
  }

  /* call arkInterpEvaluate to evaluate result */
  s = (t - ark_mem->tcur) / ark_mem->h;
  retval = arkInterpEvaluate(ark_mem, ark_mem->interp, s,
                             k, ARK_INTERP_MAX_DEGREE, dky);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, retval, "ARKode", "arkGetDky",
                    "Error calling arkInterpEvaluate");
    return(retval);
  }
  return(ARK_SUCCESS);
}